

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlNewDocRawNode(xmlDocPtr doc,xmlNsPtr ns,xmlChar *name,xmlChar *content)

{
  xmlNodePtr pxVar1;
  xmlNodePtr pxVar2;
  _xmlNode *p_Var3;
  
  pxVar1 = xmlNewDocNode(doc,ns,name,(xmlChar *)0x0);
  if ((pxVar1 != (xmlNodePtr)0x0) && (pxVar1->doc = doc, content != (xmlChar *)0x0)) {
    pxVar2 = xmlNewDocText(doc,content);
    pxVar1->children = pxVar2;
    if (pxVar2 == (xmlNodePtr)0x0) {
      p_Var3 = (_xmlNode *)0x0;
    }
    else {
      do {
        p_Var3 = pxVar2;
        p_Var3->parent = pxVar1;
        pxVar2 = p_Var3->next;
      } while (p_Var3->next != (_xmlNode *)0x0);
    }
    pxVar1->last = p_Var3;
  }
  return pxVar1;
}

Assistant:

xmlNodePtr
xmlNewDocRawNode(xmlDocPtr doc, xmlNsPtr ns,
                 const xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur;

    cur = xmlNewDocNode(doc, ns, name, NULL);
    if (cur != NULL) {
        cur->doc = doc;
	if (content != NULL) {
	    cur->children = xmlNewDocText(doc, content);
	    UPDATE_LAST_CHILD_AND_PARENT(cur)
	}
    }
    return(cur);
}